

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O3

sexp_uint_t sexp_allocated_bytes(sexp_conflict ctx,sexp_conflict x)

{
  sexp psVar1;
  long lVar2;
  
  if (((ulong)x & 3) == 0) {
    psVar1 = (ctx->value).type.setters;
    if ((long)(ulong)x->tag < (long)(psVar1->value).type.id >> 1) {
      lVar2 = *(long *)((long)&((psVar1->value).type.getters)->value + (ulong)x->tag * 8 + 8);
      return (long)*(short *)(lVar2 + 0x5e) +
             (ulong)*(ushort *)(lVar2 + 0x62) *
             *(long *)((long)&x->tag + (long)*(short *)(lVar2 + 0x60));
    }
  }
  return 0x20;
}

Assistant:

SEXP_API sexp_uint_t sexp_allocated_bytes (sexp ctx, sexp x) {
  sexp_uint_t res;
  sexp t;
  if (!sexp_pointerp(x) || (sexp_pointer_tag(x) >= sexp_context_num_types(ctx)))
    return sexp_heap_align(1);
  t = sexp_object_type(ctx, x);
  res = sexp_type_size_of_object(t, x) + SEXP_GC_PAD;
#if SEXP_USE_DEBUG_GC
  if (res == 0) {
    fprintf(stderr, SEXP_BANNER("%p zero-size object: %p (type tag: %d)"), ctx, x, sexp_pointer_tag(x));
    return 1;
  }
#endif
  return res;
}